

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O2

Vec_Int_t * Llb_DriverCountRefs(Aig_Man_t *p)

{
  int nCap;
  int iVar1;
  int *__s;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int iVar4;
  
  nCap = p->vObjs->nSize;
  pVVar2 = Vec_IntAlloc(nCap);
  pVVar2->nSize = nCap;
  __s = pVVar2->pArray;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)nCap << 2);
  }
  iVar4 = 0;
  while( true ) {
    if (p->nRegs <= iVar4) {
      return pVVar2;
    }
    pvVar3 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar4);
    if (*(ulong *)((long)pvVar3 + 8) == 0) break;
    iVar1 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24);
    if (((long)iVar1 < 0) || (nCap <= iVar1)) break;
    __s[iVar1] = __s[iVar1] + 1;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// driver issue:arises when creating
// - driver ref-counter array
// - Ns2Glo maps
// - final partition
// - change-phase cube

// LI variable is used when
// - driver drives more than one LI
// - driver is a PI
// - driver is a constant

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of times each flop driver is referenced.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Llb_DriverCountRefs( Aig_Man_t * p )
{
    Vec_Int_t * vCounts;
    Aig_Obj_t * pObj;
    int i;
    vCounts = Vec_IntStart( Aig_ManObjNumMax(p) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntAddToEntry( vCounts, Aig_ObjFaninId0(pObj), 1 );
    return vCounts;
}